

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O3

IterateResult __thiscall gl4cts::ShaderExtensionTestCase::iterate(ShaderExtensionTestCase *this)

{
  value_type *__x;
  TestContext *this_00;
  _Alloc_hider _Var1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  long lVar5;
  string shader;
  ProgramSources sources;
  ShaderProgram program;
  string local_360;
  undefined1 local_340 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328 [6];
  ios_base local_2c8 [264];
  ProgramSources local_1c0;
  ShaderProgram local_f0;
  
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     (this->mExtension)._M_dataplus._M_p);
  if (bVar2) {
    iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,st2_compute_extensionCheck,(allocator<char> *)local_340);
    replaceToken("<EXTENSION>",(this->mExtension)._M_dataplus._M_p,&local_360);
    memset(&local_1c0,0,0xac);
    local_1c0.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c0.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_1c0.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    local_1c0.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_1c0._193_8_ = 0;
    __x = (value_type *)(local_340 + 8);
    local_340._0_4_ = 5;
    local_340._8_8_ = local_328;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__x,local_360._M_dataplus._M_p,
               local_360._M_dataplus._M_p + local_360._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_1c0.sources + (local_340._0_8_ & 0xffffffff),__x);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._8_8_ != local_328) {
      operator_delete((void *)local_340._8_8_,local_328[0]._M_allocated_capacity + 1);
    }
    glu::ShaderProgram::ShaderProgram
              (&local_f0,(Functions *)CONCAT44(extraout_var,iVar3),&local_1c0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (local_f0.m_program.m_info.linkOk == false) {
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_FAIL,"Fail");
      local_340._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)__x);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)__x,"Checking shader preprocessor directives failed. Source:\n",0x38);
      _Var1._M_p = local_360._M_dataplus._M_p;
      if (local_360._M_dataplus._M_p == (char *)0x0) {
        std::ios::clear((int)__x + (int)*(undefined8 *)(local_340._8_8_ + -0x18));
      }
      else {
        sVar4 = strlen(local_360._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)__x,_Var1._M_p,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)__x,"InfoLog:\n",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)__x,
                 ((*local_f0.m_shaders[5].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_start)->m_info).infoLog._M_dataplus._M_p,
                 ((*local_f0.m_shaders[5].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_start)->m_info).infoLog._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)__x,"\n",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_340,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)__x);
      std::ios_base::~ios_base(local_2c8);
    }
    else {
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,"Pass");
    }
    glu::ShaderProgram::~ShaderProgram(&local_f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1c0.transformFeedbackVaryings);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_1c0.attribLocationBindings);
    lVar5 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&local_1c0.sources[0].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar5));
      lVar5 = lVar5 + -0x18;
    } while (lVar5 != -0x18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ShaderExtensionTestCase::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported(mExtension.c_str()))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
		return STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	std::string shader = st2_compute_extensionCheck;
	replaceToken("<EXTENSION>", mExtension.c_str(), shader);

	ProgramSources sources;
	sources << ComputeSource(shader);
	ShaderProgram program(gl, sources);

	if (!program.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		m_testCtx.getLog() << tcu::TestLog::Message << "Checking shader preprocessor directives failed. Source:\n"
						   << shader.c_str() << "InfoLog:\n"
						   << program.getShaderInfo(SHADERTYPE_COMPUTE).infoLog << "\n"
						   << tcu::TestLog::EndMessage;
		return STOP;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}